

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

bool __thiscall
ddd::DaTrie<true,_true,_false>::search_key(DaTrie<true,_true,_false> *this,Query *query)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  const_reference pvVar6;
  char *pcVar7;
  char *lhs;
  ulong uVar8;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  char *tail;
  uint32_t len;
  uint32_t value;
  uint32_t child_pos;
  undefined8 in_stack_ffffffffffffffb8;
  uint32_t local_24;
  uint32_t local_20;
  uint local_1c;
  Query *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  while( true ) {
    uVar3 = Query::node_pos(local_18);
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    bVar1 = Bc::is_leaf(pvVar6);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      uVar3 = Query::node_pos(local_18);
      pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
      local_20 = Bc::value(pvVar6);
      bVar1 = Query::is_finished(local_18);
      if (bVar1) {
        Query::set_value(local_18,local_20);
        local_1 = true;
      }
      else {
        local_24 = 0;
        pcVar7 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x165f9c);
        uVar8 = (ulong)local_20;
        lhs = Query::key(local_18);
        bVar1 = utils::match(lhs,pcVar7 + uVar8,&local_24);
        if (bVar1) {
          uVar3 = utils::extract_value(pcVar7 + uVar8 + local_24);
          Query::set_value(local_18,uVar3);
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      return local_1;
    }
    uVar3 = Query::node_pos(local_18);
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
    uVar3 = Bc::base(pvVar6);
    bVar2 = Query::label(local_18);
    local_1c = uVar3 ^ bVar2;
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_1c);
    uVar4 = Bc::check(pvVar6);
    uVar5 = Query::node_pos(local_18);
    if (uVar4 != uVar5) break;
    Query::next((Query *)CONCAT44(uVar4,uVar3),(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
    ;
  }
  return false;
}

Assistant:

bool search_key(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto child_pos = bc_[query.node_pos()].base() ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    auto value = bc_[query.node_pos()].value();
    if (query.is_finished()) {
      query.set_value(value);
      return true;
    }

    uint32_t len = 0;
    auto tail = tail_.data() + value;
    if (!utils::match(query.key(), tail, len)) {
      return false;
    }
    query.set_value(utils::extract_value(tail + len));
    return true;
  }